

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_splittingstep.c
# Opt level: O0

int splittingStep_SetOrder(ARKodeMem ark_mem,int order)

{
  int in_ESI;
  int retval;
  ARKodeSplittingStepMem step_mem;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  SplittingStepCoefficients *coefficients;
  undefined4 in_stack_ffffffffffffffe8;
  int local_4;
  
  coefficients = (SplittingStepCoefficients *)0x0;
  local_4 = splittingStep_AccessStepMem
                      ((ARKodeMem)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),(char *)0x0,
                       (ARKodeSplittingStepMem *)
                       CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  if (local_4 == 0) {
    if (in_ESI < 1) {
      in_ESI = 1;
    }
    *(int *)((long)coefficients + 0x1c) = in_ESI;
    SplittingStepCoefficients_Destroy(coefficients);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int splittingStep_SetOrder(ARKodeMem ark_mem, int order)
{
  ARKodeSplittingStepMem step_mem = NULL;
  int retval = splittingStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return retval; }

  /* set user-provided value, or default, depending on argument */
  step_mem->order = SUNMAX(1, order);

  SplittingStepCoefficients_Destroy(&step_mem->coefficients);

  return ARK_SUCCESS;
}